

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool llvm::sys::path::is_absolute(Twine *path,Style style)

{
  Style SVar1;
  bool local_fa;
  bool local_f9;
  Twine local_f8;
  bool local_d9;
  undefined1 local_d8 [7];
  bool rootName;
  byte local_b9;
  undefined1 auStack_b8 [7];
  bool rootDir;
  StringRef p;
  SmallString<128U> path_storage;
  Style style_local;
  Twine *path_local;
  
  SmallString<128U>::SmallString((SmallString<128U> *)&p.Length);
  _auStack_b8 = Twine::toStringRef(path,(SmallVectorImpl<char> *)&p.Length);
  Twine::Twine((Twine *)local_d8,(StringRef *)auStack_b8);
  local_b9 = has_root_directory((Twine *)local_d8,style);
  SVar1 = anon_unknown.dwarf_d5a34::real_style(style);
  local_f9 = true;
  if (SVar1 == windows) {
    Twine::Twine(&local_f8,(StringRef *)auStack_b8);
    local_f9 = has_root_name(&local_f8,style);
  }
  local_d9 = local_f9;
  local_fa = false;
  if ((local_b9 & 1) != 0) {
    local_fa = local_f9;
  }
  SmallString<128U>::~SmallString((SmallString<128U> *)&p.Length);
  return local_fa;
}

Assistant:

bool is_absolute(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  bool rootDir = has_root_directory(p, style);
  bool rootName =
      (real_style(style) != Style::windows) || has_root_name(p, style);

  return rootDir && rootName;
}